

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O3

uint RDL_countURFs(RDL_URFinfo *uInfo)

{
  long lVar1;
  bool bVar2;
  void *__ptr;
  void *pvVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = uInfo->nofWeights;
  uVar6 = (ulong)uVar5;
  __ptr = malloc(uVar6 * 8);
  if (uVar6 != 0) {
    puVar4 = uInfo->nofProtos;
    uVar8 = 0;
    do {
      pvVar3 = malloc((ulong)puVar4[uVar8]);
      *(void **)((long)__ptr + uVar8 * 8) = pvVar3;
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
    if (uVar5 != 0) {
      puVar4 = uInfo->nofProtos;
      uVar8 = 0;
      do {
        if (puVar4[uVar8] != 0) {
          lVar1 = *(long *)((long)__ptr + uVar8 * 8);
          uVar6 = 0;
          do {
            *(undefined1 *)(lVar1 + uVar6) = 0;
            uVar6 = uVar6 + 1;
            puVar4 = uInfo->nofProtos;
          } while (uVar6 < puVar4[uVar8]);
          uVar6 = (ulong)uInfo->nofWeights;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar6);
      if ((int)uVar6 != 0) {
        puVar4 = uInfo->nofProtos;
        uVar8 = 0;
        uVar5 = 0;
        do {
          uVar7 = (ulong)puVar4[uVar8];
          if (puVar4[uVar8] != 0) {
            lVar1 = *(long *)((long)__ptr + uVar8 * 8);
            uVar6 = 0;
            do {
              if (((*(char *)(lVar1 + uVar6) != '\x01') &&
                  (uInfo->URFrel[uVar8][uVar6][uVar6] != '\0')) && (uVar6 < uVar7)) {
                bVar2 = false;
                uVar7 = uVar6;
                do {
                  if (uInfo->URFrel[uVar8][uVar6][uVar7] == '\x01') {
                    *(undefined1 *)(lVar1 + uVar7) = 1;
                    uVar5 = uVar5 + !bVar2;
                    puVar4 = uInfo->nofProtos;
                    bVar2 = true;
                  }
                  uVar7 = uVar7 + 1;
                } while (uVar7 < puVar4[uVar8]);
              }
              uVar6 = uVar6 + 1;
              uVar7 = (ulong)puVar4[uVar8];
            } while (uVar6 < uVar7);
            uVar6 = (ulong)uInfo->nofWeights;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar6);
        if ((int)uVar6 != 0) {
          uVar6 = 0;
          do {
            free(*(void **)((long)__ptr + uVar6 * 8));
            uVar6 = uVar6 + 1;
          } while (uVar6 < uInfo->nofWeights);
        }
        goto LAB_00107e1f;
      }
    }
  }
  uVar5 = 0;
LAB_00107e1f:
  free(__ptr);
  return uVar5;
}

Assistant:

unsigned RDL_countURFs(RDL_URFinfo *uInfo)
{
  unsigned URFRelCount=0, weightIdx, i, j;
  char **alreadyInURF; /*for each weight: an array storing if a RCF is already
                        part of a URF*/
  char increase;

  alreadyInURF = malloc(uInfo->nofWeights * sizeof(*alreadyInURF));
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    alreadyInURF[i] = malloc(uInfo->nofProtos[i] * sizeof(*alreadyInURF[i]));
  }
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    for(j=0; j<uInfo->nofProtos[i]; ++j)
    {
      alreadyInURF[i][j] = 0;
    }
  }

  /*count number of 1s indicating URF-relation*/
  for(weightIdx=0; weightIdx<uInfo->nofWeights; ++weightIdx)
  {
    for(i=0; i<uInfo->nofProtos[weightIdx]; ++i)
    {
      if(alreadyInURF[weightIdx][i] == 1 || uInfo->URFrel[weightIdx][i][i] == 0)
      {
        continue;
      }
      increase = 0;
      for(j=i; j<uInfo->nofProtos[weightIdx]; ++j)
      {
        if(uInfo->URFrel[weightIdx][i][j] == 1)
        {
          alreadyInURF[weightIdx][j] = 1;
          if(increase == 0)
          {
            ++URFRelCount;
            increase = 1;
          }
        }
      }
    }
  }

  for(i=0; i<uInfo->nofWeights; ++i)
  {
    free(alreadyInURF[i]);
  }
  free(alreadyInURF);
  return URFRelCount;
}